

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void iadst16x16_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  uint in_R9D;
  undefined4 in_register_0000008c;
  int iVar85;
  int iVar86;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  __m128i temp2;
  __m128i temp1;
  __m128i y;
  __m128i x;
  __m128i v [16];
  __m128i zero;
  __m128i rnding;
  __m128i cospi32;
  __m128i cospi16;
  __m128i cospi48;
  __m128i cospi56;
  __m128i cospi8;
  __m128i cospi62;
  __m128i cospi2;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffff2a8;
  undefined4 in_stack_fffffffffffff2b0;
  undefined8 uVar119;
  undefined8 local_d38;
  undefined8 uStack_d30;
  int local_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined1 local_cf8 [16];
  undefined1 local_ce8 [16];
  int local_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int local_cc8;
  int iStack_cc4;
  int iStack_cc0;
  int iStack_cbc;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  int32_t *local_b48;
  uint local_b40;
  int local_b3c;
  int local_b38;
  uint local_b34;
  undefined8 *local_b30;
  undefined1 (*local_b28) [16];
  uint local_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  uint local_afc;
  undefined8 local_af8;
  undefined8 uStack_af0;
  uint local_adc;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  uint local_abc;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  uint local_a9c;
  undefined8 local_a98;
  undefined8 uStack_a90;
  uint local_a7c;
  undefined8 local_a78;
  undefined8 uStack_a70;
  uint local_a5c;
  undefined8 local_a58;
  undefined8 uStack_a50;
  uint local_a3c;
  undefined8 local_a38;
  undefined8 uStack_a30;
  uint local_a1c;
  undefined8 local_a18;
  undefined8 uStack_a10;
  uint local_9fc;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  uint local_9dc;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  uint local_9bc;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  uint local_99c;
  undefined8 local_998;
  undefined8 uStack_990;
  uint local_97c;
  undefined8 local_978;
  undefined8 uStack_970;
  uint local_95c;
  undefined8 local_958;
  undefined8 uStack_950;
  uint local_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  int local_430;
  int local_42c;
  int local_428;
  int32_t local_424;
  int32_t local_420;
  int32_t local_41c;
  int32_t local_418;
  int32_t local_414;
  int32_t local_410;
  int32_t local_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int32_t local_118;
  int32_t local_114;
  int32_t local_110;
  int32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int32_t local_d8;
  int32_t local_d4;
  int32_t local_d0;
  int32_t local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int32_t local_b8;
  int32_t local_b4;
  int32_t local_b0;
  int32_t local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int32_t local_98;
  int32_t local_94;
  int32_t local_90;
  int32_t local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int32_t local_78;
  int32_t local_74;
  int32_t local_70;
  int32_t local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_b40 = in_R9D;
  local_b3c = in_R8D;
  local_b38 = in_ECX;
  local_b34 = in_EDX;
  local_b30 = in_RSI;
  local_b28 = in_RDI;
  local_b48 = cospi_arr(in_EDX);
  local_40c = local_b48[2];
  local_b58 = CONCAT44(local_40c,local_40c);
  uStack_b50 = CONCAT44(local_40c,local_40c);
  local_410 = local_b48[0x3e];
  local_b68 = CONCAT44(local_410,local_410);
  uStack_b60 = CONCAT44(local_410,local_410);
  local_414 = local_b48[8];
  local_b78 = CONCAT44(local_414,local_414);
  uStack_b70 = CONCAT44(local_414,local_414);
  local_418 = local_b48[0x38];
  local_b88 = CONCAT44(local_418,local_418);
  uStack_b80 = CONCAT44(local_418,local_418);
  local_41c = local_b48[0x30];
  local_b98 = CONCAT44(local_41c,local_41c);
  uStack_b90 = CONCAT44(local_41c,local_41c);
  local_420 = local_b48[0x10];
  local_ba8 = CONCAT44(local_420,local_420);
  uStack_ba0 = CONCAT44(local_420,local_420);
  local_424 = local_b48[0x20];
  local_bb8 = CONCAT44(local_424,local_424);
  uStack_bb0 = CONCAT44(local_424,local_424);
  local_428 = 1 << ((char)local_b34 - 1U & 0x1f);
  local_bc8 = CONCAT44(local_428,local_428);
  uStack_bc0 = CONCAT44(local_428,local_428);
  local_448 = 0;
  uStack_440 = 0;
  local_bd8 = 0;
  uStack_bd0 = 0;
  local_158 = *(undefined8 *)*local_b28;
  uStack_150 = *(undefined8 *)(*local_b28 + 8);
  auVar40._8_8_ = uStack_b60;
  auVar40._0_8_ = local_b68;
  auVar87 = pmulld(*local_b28,auVar40);
  local_ce8._0_8_ = auVar87._0_8_;
  local_ce8._8_8_ = auVar87._8_8_;
  local_658 = local_ce8._0_8_;
  uVar69 = local_658;
  uStack_650 = local_ce8._8_8_;
  uVar70 = uStack_650;
  local_658._0_4_ = auVar87._0_4_;
  local_658._4_4_ = auVar87._4_4_;
  uStack_650._0_4_ = auVar87._8_4_;
  uStack_650._4_4_ = auVar87._12_4_;
  local_938 = CONCAT44(local_658._4_4_ + local_428,(int)local_658 + local_428);
  uStack_930 = CONCAT44(uStack_650._4_4_ + local_428,(int)uStack_650 + local_428);
  local_93c = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_cd8 = (int)local_658 + local_428 >> auVar87;
  iStack_cd4 = local_658._4_4_ + local_428 >> auVar87;
  iStack_cd0 = (int)uStack_650 + local_428 >> auVar87;
  iStack_ccc = uStack_650._4_4_ + local_428 >> auVar87;
  local_178 = *(undefined8 *)*local_b28;
  uStack_170 = *(undefined8 *)(*local_b28 + 8);
  auVar39._8_8_ = uStack_b50;
  auVar39._0_8_ = local_b58;
  auVar87 = pmulld(*local_b28,auVar39);
  local_ce8._0_8_ = auVar87._0_8_;
  local_ce8._8_8_ = auVar87._8_8_;
  local_458 = 0;
  uStack_450 = 0;
  local_468 = local_ce8._0_8_;
  uVar83 = local_468;
  uStack_460 = local_ce8._8_8_;
  uVar84 = uStack_460;
  local_468._0_4_ = auVar87._0_4_;
  local_468._4_4_ = auVar87._4_4_;
  uStack_460._0_4_ = auVar87._8_4_;
  uStack_460._4_4_ = auVar87._12_4_;
  local_678 = CONCAT44(-local_468._4_4_,-(int)local_468);
  uStack_670 = CONCAT44(-uStack_460._4_4_,-(int)uStack_460);
  local_cc8 = -(int)local_468 + local_428;
  iStack_cc4 = -local_468._4_4_ + local_428;
  iStack_cc0 = -(int)uStack_460 + local_428;
  iStack_cbc = -uStack_460._4_4_ + local_428;
  local_958 = CONCAT44(iStack_cc4,local_cc8);
  uStack_950 = CONCAT44(iStack_cbc,iStack_cc0);
  local_95c = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_cc8 = local_cc8 >> auVar87;
  iStack_cc4 = iStack_cc4 >> auVar87;
  iStack_cc0 = iStack_cc0 >> auVar87;
  iStack_cbc = iStack_cbc >> auVar87;
  local_1d8 = CONCAT44(iStack_cd4,local_cd8);
  uStack_1d0 = CONCAT44(iStack_ccc,iStack_cd0);
  local_1f8 = CONCAT44(iStack_cc4,local_cc8);
  uStack_1f0 = CONCAT44(iStack_cbc,iStack_cc0);
  auVar38._8_8_ = uStack_1d0;
  auVar38._0_8_ = local_1d8;
  auVar37._8_8_ = uStack_b70;
  auVar37._0_8_ = local_b78;
  auVar87 = pmulld(auVar38,auVar37);
  auVar36._8_8_ = uStack_1f0;
  auVar36._0_8_ = local_1f8;
  auVar35._8_8_ = uStack_b80;
  auVar35._0_8_ = local_b88;
  auVar88 = pmulld(auVar36,auVar35);
  local_d08 = auVar87._0_8_;
  uStack_d00 = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_698 = local_d08;
  uVar67 = local_698;
  uStack_690 = uStack_d00;
  uVar68 = uStack_690;
  local_6a8 = local_ce8._0_8_;
  uVar65 = local_6a8;
  uStack_6a0 = local_ce8._8_8_;
  uVar66 = uStack_6a0;
  local_698._0_4_ = auVar87._0_4_;
  local_698._4_4_ = auVar87._4_4_;
  uStack_690._0_4_ = auVar87._8_4_;
  uStack_690._4_4_ = auVar87._12_4_;
  local_6a8._0_4_ = auVar88._0_4_;
  local_6a8._4_4_ = auVar88._4_4_;
  uStack_6a0._0_4_ = auVar88._8_4_;
  uStack_6a0._4_4_ = auVar88._12_4_;
  local_d08 = CONCAT44(local_698._4_4_ + local_6a8._4_4_,(int)local_698 + (int)local_6a8);
  uStack_d00._0_4_ = (int)uStack_690 + (int)uStack_6a0;
  uStack_d00._4_4_ = uStack_690._4_4_ + uStack_6a0._4_4_;
  local_6b8 = local_d08;
  uStack_6b0 = uStack_d00;
  iVar85 = (int)local_698 + (int)local_6a8 + local_428;
  iVar89 = local_698._4_4_ + local_6a8._4_4_ + local_428;
  iVar97 = (int)uStack_690 + (int)uStack_6a0 + local_428;
  iVar107 = uStack_690._4_4_ + uStack_6a0._4_4_ + local_428;
  local_d08 = CONCAT44(iVar89,iVar85);
  uStack_d00._0_4_ = iVar97;
  uStack_d00._4_4_ = iVar107;
  local_978 = local_d08;
  uStack_970 = uStack_d00;
  local_97c = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar85 = iVar85 >> auVar87;
  iVar89 = iVar89 >> auVar87;
  iVar97 = iVar97 >> auVar87;
  iVar107 = iVar107 >> auVar87;
  local_d08 = CONCAT44(iVar89,iVar85);
  local_298 = local_d08;
  uStack_d00._0_4_ = iVar97;
  uStack_d00._4_4_ = iVar107;
  auVar34._8_8_ = uStack_1d0;
  auVar34._0_8_ = local_1d8;
  auVar33._8_8_ = uStack_b80;
  auVar33._0_8_ = local_b88;
  auVar87 = pmulld(auVar34,auVar33);
  auVar32._8_8_ = uStack_1f0;
  auVar32._0_8_ = local_1f8;
  auVar31._8_8_ = uStack_b70;
  auVar31._0_8_ = local_b78;
  auVar88 = pmulld(auVar32,auVar31);
  local_d18 = auVar87._0_8_;
  uStack_d10 = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_478 = local_d18;
  uVar81 = local_478;
  uStack_470 = uStack_d10;
  uVar82 = uStack_470;
  local_488 = local_ce8._0_8_;
  uVar79 = local_488;
  uStack_480 = local_ce8._8_8_;
  uVar80 = uStack_480;
  local_478._0_4_ = auVar87._0_4_;
  local_478._4_4_ = auVar87._4_4_;
  uStack_470._0_4_ = auVar87._8_4_;
  uStack_470._4_4_ = auVar87._12_4_;
  local_488._0_4_ = auVar88._0_4_;
  local_488._4_4_ = auVar88._4_4_;
  uStack_480._0_4_ = auVar88._8_4_;
  uStack_480._4_4_ = auVar88._12_4_;
  local_d18 = CONCAT44(local_478._4_4_ - local_488._4_4_,(int)local_478 - (int)local_488);
  uStack_d10._0_4_ = (int)uStack_470 - (int)uStack_480;
  uStack_d10._4_4_ = uStack_470._4_4_ - uStack_480._4_4_;
  local_6d8 = local_d18;
  uStack_6d0 = uStack_d10;
  iVar86 = ((int)local_478 - (int)local_488) + local_428;
  iVar90 = (local_478._4_4_ - local_488._4_4_) + local_428;
  iVar98 = ((int)uStack_470 - (int)uStack_480) + local_428;
  iVar108 = (uStack_470._4_4_ - uStack_480._4_4_) + local_428;
  local_d18 = CONCAT44(iVar90,iVar86);
  uStack_d10._0_4_ = iVar98;
  uStack_d10._4_4_ = iVar108;
  local_998 = local_d18;
  uStack_990 = uStack_d10;
  local_99c = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_d18 = CONCAT44(iVar90 >> auVar87,iVar86 >> auVar87);
  local_2b8 = local_d18;
  uStack_d10._0_4_ = iVar98 >> auVar87;
  uStack_d10._4_4_ = iVar108 >> auVar87;
  uStack_290 = uStack_d00;
  local_c58 = local_d08;
  uStack_c50 = uStack_d00;
  uStack_2b0 = uStack_d10;
  local_c48 = local_d18;
  uStack_c40 = uStack_d10;
  local_258 = CONCAT44(iStack_cd4,local_cd8);
  uStack_250 = CONCAT44(iStack_ccc,iStack_cd0);
  local_278 = CONCAT44(iStack_cc4,local_cc8);
  uStack_270 = CONCAT44(iStack_cbc,iStack_cc0);
  auVar30._8_8_ = uStack_250;
  auVar30._0_8_ = local_258;
  auVar29._8_8_ = uStack_ba0;
  auVar29._0_8_ = local_ba8;
  auVar87 = pmulld(auVar30,auVar29);
  auVar28._8_8_ = uStack_270;
  auVar28._0_8_ = local_278;
  auVar27._8_8_ = uStack_b90;
  auVar27._0_8_ = local_b98;
  auVar88 = pmulld(auVar28,auVar27);
  local_d08 = auVar87._0_8_;
  uStack_d00 = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_6f8 = local_d08;
  uVar63 = local_6f8;
  uStack_6f0 = uStack_d00;
  uVar64 = uStack_6f0;
  local_708 = local_ce8._0_8_;
  uVar61 = local_708;
  uStack_700 = local_ce8._8_8_;
  uVar62 = uStack_700;
  local_6f8._0_4_ = auVar87._0_4_;
  local_6f8._4_4_ = auVar87._4_4_;
  uStack_6f0._0_4_ = auVar87._8_4_;
  uStack_6f0._4_4_ = auVar87._12_4_;
  local_708._0_4_ = auVar88._0_4_;
  local_708._4_4_ = auVar88._4_4_;
  uStack_700._0_4_ = auVar88._8_4_;
  uStack_700._4_4_ = auVar88._12_4_;
  local_d08 = CONCAT44(local_6f8._4_4_ + local_708._4_4_,(int)local_6f8 + (int)local_708);
  uStack_d00._0_4_ = (int)uStack_6f0 + (int)uStack_700;
  uStack_d00._4_4_ = uStack_6f0._4_4_ + uStack_700._4_4_;
  local_718 = local_d08;
  uStack_710 = uStack_d00;
  iVar86 = (int)local_6f8 + (int)local_708 + local_428;
  iVar91 = local_6f8._4_4_ + local_708._4_4_ + local_428;
  iVar99 = (int)uStack_6f0 + (int)uStack_700 + local_428;
  iVar109 = uStack_6f0._4_4_ + uStack_700._4_4_ + local_428;
  local_d08 = CONCAT44(iVar91,iVar86);
  uStack_d00._0_4_ = iVar99;
  uStack_d00._4_4_ = iVar109;
  local_9b8 = local_d08;
  uStack_9b0 = uStack_d00;
  local_9bc = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar86 = iVar86 >> auVar87;
  iVar91 = iVar91 >> auVar87;
  iVar99 = iVar99 >> auVar87;
  iVar109 = iVar109 >> auVar87;
  local_d08 = CONCAT44(iVar91,iVar86);
  local_358 = local_d08;
  uStack_d00._0_4_ = iVar99;
  uStack_d00._4_4_ = iVar109;
  auVar26._8_8_ = uStack_250;
  auVar26._0_8_ = local_258;
  auVar25._8_8_ = uStack_b90;
  auVar25._0_8_ = local_b98;
  auVar87 = pmulld(auVar26,auVar25);
  auVar24._8_8_ = uStack_270;
  auVar24._0_8_ = local_278;
  auVar23._8_8_ = uStack_ba0;
  auVar23._0_8_ = local_ba8;
  auVar88 = pmulld(auVar24,auVar23);
  local_d18 = auVar87._0_8_;
  uStack_d10 = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_498 = local_d18;
  uVar77 = local_498;
  uStack_490 = uStack_d10;
  uVar78 = uStack_490;
  local_4a8 = local_ce8._0_8_;
  uVar75 = local_4a8;
  uStack_4a0 = local_ce8._8_8_;
  uVar76 = uStack_4a0;
  local_498._0_4_ = auVar87._0_4_;
  local_498._4_4_ = auVar87._4_4_;
  uStack_490._0_4_ = auVar87._8_4_;
  uStack_490._4_4_ = auVar87._12_4_;
  local_4a8._0_4_ = auVar88._0_4_;
  local_4a8._4_4_ = auVar88._4_4_;
  uStack_4a0._0_4_ = auVar88._8_4_;
  uStack_4a0._4_4_ = auVar88._12_4_;
  local_d18 = CONCAT44(local_498._4_4_ - local_4a8._4_4_,(int)local_498 - (int)local_4a8);
  uStack_d10._0_4_ = (int)uStack_490 - (int)uStack_4a0;
  uStack_d10._4_4_ = uStack_490._4_4_ - uStack_4a0._4_4_;
  local_738 = local_d18;
  uStack_730 = uStack_d10;
  iVar90 = ((int)local_498 - (int)local_4a8) + local_428;
  iVar98 = (local_498._4_4_ - local_4a8._4_4_) + local_428;
  iVar108 = ((int)uStack_490 - (int)uStack_4a0) + local_428;
  iVar110 = (uStack_490._4_4_ - uStack_4a0._4_4_) + local_428;
  local_d18 = CONCAT44(iVar98,iVar90);
  uStack_d10._0_4_ = iVar108;
  uStack_d10._4_4_ = iVar110;
  local_9d8 = local_d18;
  uStack_9d0 = uStack_d10;
  local_9dc = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_d18 = CONCAT44(iVar98 >> auVar87,iVar90 >> auVar87);
  local_378 = local_d18;
  uStack_d10._0_4_ = iVar108 >> auVar87;
  uStack_d10._4_4_ = iVar110 >> auVar87;
  uStack_350 = uStack_d00;
  local_c98 = local_d08;
  uStack_c90 = uStack_d00;
  uStack_370 = uStack_d10;
  local_c88 = local_d18;
  uStack_c80 = uStack_d10;
  auVar22._8_8_ = uStack_290;
  auVar22._0_8_ = local_298;
  auVar21._8_8_ = uStack_ba0;
  auVar21._0_8_ = local_ba8;
  auVar87 = pmulld(auVar22,auVar21);
  auVar20._8_8_ = uStack_2b0;
  auVar20._0_8_ = local_2b8;
  auVar19._8_8_ = uStack_b90;
  auVar19._0_8_ = local_b98;
  auVar88 = pmulld(auVar20,auVar19);
  local_d08 = auVar87._0_8_;
  uStack_d00 = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_758 = local_d08;
  uVar59 = local_758;
  uStack_750 = uStack_d00;
  uVar60 = uStack_750;
  local_768 = local_ce8._0_8_;
  uVar57 = local_768;
  uStack_760 = local_ce8._8_8_;
  uVar58 = uStack_760;
  local_758._0_4_ = auVar87._0_4_;
  local_758._4_4_ = auVar87._4_4_;
  uStack_750._0_4_ = auVar87._8_4_;
  uStack_750._4_4_ = auVar87._12_4_;
  local_768._0_4_ = auVar88._0_4_;
  local_768._4_4_ = auVar88._4_4_;
  uStack_760._0_4_ = auVar88._8_4_;
  uStack_760._4_4_ = auVar88._12_4_;
  local_d08 = CONCAT44(local_758._4_4_ + local_768._4_4_,(int)local_758 + (int)local_768);
  uStack_d00._0_4_ = (int)uStack_750 + (int)uStack_760;
  uStack_d00._4_4_ = uStack_750._4_4_ + uStack_760._4_4_;
  local_778 = local_d08;
  uStack_770 = uStack_d00;
  iVar90 = (int)local_758 + (int)local_768 + local_428;
  iVar98 = local_758._4_4_ + local_768._4_4_ + local_428;
  iVar108 = (int)uStack_750 + (int)uStack_760 + local_428;
  iVar110 = uStack_750._4_4_ + uStack_760._4_4_ + local_428;
  local_d08 = CONCAT44(iVar98,iVar90);
  uStack_d00._0_4_ = iVar108;
  uStack_d00._4_4_ = iVar110;
  local_9f8 = local_d08;
  uStack_9f0 = uStack_d00;
  local_9fc = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_d08 = CONCAT44(iVar98 >> auVar87,iVar90 >> auVar87);
  uStack_d00._0_4_ = iVar108 >> auVar87;
  uStack_d00._4_4_ = iVar110 >> auVar87;
  local_2d8 = local_298;
  uStack_2d0 = uStack_290;
  auVar18._8_8_ = uStack_290;
  auVar18._0_8_ = local_298;
  auVar17._8_8_ = uStack_b90;
  auVar17._0_8_ = local_b98;
  auVar87 = pmulld(auVar18,auVar17);
  local_2f8 = local_2b8;
  uStack_2f0 = uStack_2b0;
  auVar16._8_8_ = uStack_2b0;
  auVar16._0_8_ = local_2b8;
  auVar15._8_8_ = uStack_ba0;
  auVar15._0_8_ = local_ba8;
  auVar88 = pmulld(auVar16,auVar15);
  local_d18 = auVar87._0_8_;
  uStack_d10 = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_4b8 = local_d18;
  uVar73 = local_4b8;
  uStack_4b0 = uStack_d10;
  uVar74 = uStack_4b0;
  local_4c8 = local_ce8._0_8_;
  uVar71 = local_4c8;
  uStack_4c0 = local_ce8._8_8_;
  uVar72 = uStack_4c0;
  local_4b8._0_4_ = auVar87._0_4_;
  local_4b8._4_4_ = auVar87._4_4_;
  uStack_4b0._0_4_ = auVar87._8_4_;
  uStack_4b0._4_4_ = auVar87._12_4_;
  local_4c8._0_4_ = auVar88._0_4_;
  local_4c8._4_4_ = auVar88._4_4_;
  uStack_4c0._0_4_ = auVar88._8_4_;
  uStack_4c0._4_4_ = auVar88._12_4_;
  local_d18 = CONCAT44(local_4b8._4_4_ - local_4c8._4_4_,(int)local_4b8 - (int)local_4c8);
  uStack_d10._0_4_ = (int)uStack_4b0 - (int)uStack_4c0;
  uStack_d10._4_4_ = uStack_4b0._4_4_ - uStack_4c0._4_4_;
  local_798 = local_d18;
  uStack_790 = uStack_d10;
  iVar90 = ((int)local_4b8 - (int)local_4c8) + local_428;
  iVar92 = (local_4b8._4_4_ - local_4c8._4_4_) + local_428;
  iVar100 = ((int)uStack_4b0 - (int)uStack_4c0) + local_428;
  iVar111 = (uStack_4b0._4_4_ - uStack_4c0._4_4_) + local_428;
  local_d18 = CONCAT44(iVar92,iVar90);
  uStack_d10._0_4_ = iVar100;
  uStack_d10._4_4_ = iVar111;
  local_a18 = local_d18;
  uStack_a10 = uStack_d10;
  local_a1c = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar90 = iVar90 >> auVar87;
  iVar92 = iVar92 >> auVar87;
  iVar100 = iVar100 >> auVar87;
  iVar111 = iVar111 >> auVar87;
  local_d18 = CONCAT44(iVar92,iVar90);
  uStack_d10._0_4_ = iVar100;
  uStack_d10._4_4_ = iVar111;
  local_c18 = local_d08;
  uStack_c10 = uStack_d00;
  local_c08 = local_d18;
  uStack_c00 = uStack_d10;
  local_318 = CONCAT44(iStack_cd4,local_cd8);
  uStack_310 = CONCAT44(iStack_ccc,iStack_cd0);
  local_338 = CONCAT44(iStack_cc4,local_cc8);
  uStack_330 = CONCAT44(iStack_cbc,iStack_cc0);
  auVar14._8_8_ = uStack_310;
  auVar14._0_8_ = local_318;
  auVar13._8_8_ = uStack_bb0;
  auVar13._0_8_ = local_bb8;
  auVar87 = pmulld(auVar14,auVar13);
  auVar12._8_8_ = uStack_330;
  auVar12._0_8_ = local_338;
  auVar11._8_8_ = uStack_bb0;
  auVar11._0_8_ = local_bb8;
  auVar88 = pmulld(auVar12,auVar11);
  local_cf8._0_8_ = auVar87._0_8_;
  local_cf8._8_8_ = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_7b8 = local_cf8._0_8_;
  uVar55 = local_7b8;
  uStack_7b0 = local_cf8._8_8_;
  uVar56 = uStack_7b0;
  local_7c8 = local_ce8._0_8_;
  uVar53 = local_7c8;
  uStack_7c0 = local_ce8._8_8_;
  uVar54 = uStack_7c0;
  local_7b8._0_4_ = auVar87._0_4_;
  local_7b8._4_4_ = auVar87._4_4_;
  uStack_7b0._0_4_ = auVar87._8_4_;
  uStack_7b0._4_4_ = auVar87._12_4_;
  local_7c8._0_4_ = auVar88._0_4_;
  local_7c8._4_4_ = auVar88._4_4_;
  uStack_7c0._0_4_ = auVar88._8_4_;
  uStack_7c0._4_4_ = auVar88._12_4_;
  local_cb8 = CONCAT44(local_7b8._4_4_ + local_7c8._4_4_,(int)local_7b8 + (int)local_7c8);
  uStack_cb0 = CONCAT44(uStack_7b0._4_4_ + uStack_7c0._4_4_,(int)uStack_7b0 + (int)uStack_7c0);
  local_7d8 = local_cb8;
  uStack_7d0 = uStack_cb0;
  iVar98 = (int)local_7b8 + (int)local_7c8 + local_428;
  iVar93 = local_7b8._4_4_ + local_7c8._4_4_ + local_428;
  iVar101 = (int)uStack_7b0 + (int)uStack_7c0 + local_428;
  iVar112 = uStack_7b0._4_4_ + uStack_7c0._4_4_ + local_428;
  local_cb8 = CONCAT44(iVar93,iVar98);
  uStack_cb0 = CONCAT44(iVar112,iVar101);
  local_a38 = local_cb8;
  uStack_a30 = uStack_cb0;
  local_a3c = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar98 = iVar98 >> auVar87;
  iVar93 = iVar93 >> auVar87;
  iVar101 = iVar101 >> auVar87;
  iVar112 = iVar112 >> auVar87;
  local_cb8 = CONCAT44(iVar93,iVar98);
  uStack_cb0 = CONCAT44(iVar112,iVar101);
  local_4d8 = local_cf8._0_8_;
  uStack_4d0 = local_cf8._8_8_;
  local_4e8 = local_ce8._0_8_;
  uStack_4e0 = local_ce8._8_8_;
  local_ca8 = CONCAT44(local_7b8._4_4_ - local_7c8._4_4_,(int)local_7b8 - (int)local_7c8);
  uStack_ca0 = CONCAT44(uStack_7b0._4_4_ - uStack_7c0._4_4_,(int)uStack_7b0 - (int)uStack_7c0);
  local_7f8 = local_ca8;
  uStack_7f0 = uStack_ca0;
  iVar108 = ((int)local_7b8 - (int)local_7c8) + local_428;
  iVar110 = (local_7b8._4_4_ - local_7c8._4_4_) + local_428;
  iVar102 = ((int)uStack_7b0 - (int)uStack_7c0) + local_428;
  iVar113 = (uStack_7b0._4_4_ - uStack_7c0._4_4_) + local_428;
  local_ca8 = CONCAT44(iVar110,iVar108);
  uStack_ca0 = CONCAT44(iVar113,iVar102);
  local_a58 = local_ca8;
  uStack_a50 = uStack_ca0;
  local_a5c = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_ca8 = CONCAT44(iVar110 >> auVar87,iVar108 >> auVar87);
  uStack_ca0 = CONCAT44(iVar113 >> auVar87,iVar102 >> auVar87);
  auVar10._8_8_ = uStack_350;
  auVar10._0_8_ = local_358;
  auVar9._8_8_ = uStack_bb0;
  auVar9._0_8_ = local_bb8;
  auVar87 = pmulld(auVar10,auVar9);
  auVar8._8_8_ = uStack_370;
  auVar8._0_8_ = local_378;
  auVar7._8_8_ = uStack_bb0;
  auVar7._0_8_ = local_bb8;
  auVar88 = pmulld(auVar8,auVar7);
  local_cf8._0_8_ = auVar87._0_8_;
  local_cf8._8_8_ = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_818 = local_cf8._0_8_;
  uVar51 = local_818;
  uStack_810 = local_cf8._8_8_;
  uVar52 = uStack_810;
  local_828 = local_ce8._0_8_;
  uVar49 = local_828;
  uStack_820 = local_ce8._8_8_;
  uVar50 = uStack_820;
  local_818._0_4_ = auVar87._0_4_;
  local_818._4_4_ = auVar87._4_4_;
  uStack_810._0_4_ = auVar87._8_4_;
  uStack_810._4_4_ = auVar87._12_4_;
  local_828._0_4_ = auVar88._0_4_;
  local_828._4_4_ = auVar88._4_4_;
  uStack_820._0_4_ = auVar88._8_4_;
  uStack_820._4_4_ = auVar88._12_4_;
  local_c78 = CONCAT44(local_818._4_4_ + local_828._4_4_,(int)local_818 + (int)local_828);
  uStack_c70 = CONCAT44(uStack_810._4_4_ + uStack_820._4_4_,(int)uStack_810 + (int)uStack_820);
  local_838 = local_c78;
  uStack_830 = uStack_c70;
  iVar108 = (int)local_818 + (int)local_828 + local_428;
  iVar110 = local_818._4_4_ + local_828._4_4_ + local_428;
  iVar102 = (int)uStack_810 + (int)uStack_820 + local_428;
  iVar113 = uStack_810._4_4_ + uStack_820._4_4_ + local_428;
  local_c78 = CONCAT44(iVar110,iVar108);
  uStack_c70 = CONCAT44(iVar113,iVar102);
  local_a78 = local_c78;
  uStack_a70 = uStack_c70;
  local_a7c = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_c78 = CONCAT44(iVar110 >> auVar87,iVar108 >> auVar87);
  uStack_c70 = CONCAT44(iVar113 >> auVar87,iVar102 >> auVar87);
  local_4f8 = local_cf8._0_8_;
  uStack_4f0 = local_cf8._8_8_;
  local_508 = local_ce8._0_8_;
  uStack_500 = local_ce8._8_8_;
  local_c68 = CONCAT44(local_818._4_4_ - local_828._4_4_,(int)local_818 - (int)local_828);
  uStack_c60 = CONCAT44(uStack_810._4_4_ - uStack_820._4_4_,(int)uStack_810 - (int)uStack_820);
  local_858 = local_c68;
  uStack_850 = uStack_c60;
  iVar108 = ((int)local_818 - (int)local_828) + local_428;
  iVar94 = (local_818._4_4_ - local_828._4_4_) + local_428;
  iVar103 = ((int)uStack_810 - (int)uStack_820) + local_428;
  iVar114 = (uStack_810._4_4_ - uStack_820._4_4_) + local_428;
  local_c68 = CONCAT44(iVar94,iVar108);
  uStack_c60 = CONCAT44(iVar114,iVar103);
  local_a98 = local_c68;
  uStack_a90 = uStack_c60;
  local_a9c = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar108 = iVar108 >> auVar87;
  iVar94 = iVar94 >> auVar87;
  iVar103 = iVar103 >> auVar87;
  iVar114 = iVar114 >> auVar87;
  local_c68 = CONCAT44(iVar94,iVar108);
  uStack_c60 = CONCAT44(iVar114,iVar103);
  local_398 = local_298;
  uStack_390 = uStack_290;
  auVar6._8_8_ = uStack_290;
  auVar6._0_8_ = local_298;
  auVar5._8_8_ = uStack_bb0;
  auVar5._0_8_ = local_bb8;
  auVar87 = pmulld(auVar6,auVar5);
  local_3b8 = local_2b8;
  uStack_3b0 = uStack_2b0;
  auVar4._8_8_ = uStack_2b0;
  auVar4._0_8_ = local_2b8;
  auVar3._8_8_ = uStack_bb0;
  auVar3._0_8_ = local_bb8;
  auVar88 = pmulld(auVar4,auVar3);
  local_cf8._0_8_ = auVar87._0_8_;
  local_cf8._8_8_ = auVar87._8_8_;
  local_ce8._0_8_ = auVar88._0_8_;
  local_ce8._8_8_ = auVar88._8_8_;
  local_878 = local_cf8._0_8_;
  uVar47 = local_878;
  uStack_870 = local_cf8._8_8_;
  uVar48 = uStack_870;
  local_888 = local_ce8._0_8_;
  uVar45 = local_888;
  uStack_880 = local_ce8._8_8_;
  uVar46 = uStack_880;
  local_878._0_4_ = auVar87._0_4_;
  local_878._4_4_ = auVar87._4_4_;
  uStack_870._0_4_ = auVar87._8_4_;
  uStack_870._4_4_ = auVar87._12_4_;
  local_888._0_4_ = auVar88._0_4_;
  local_888._4_4_ = auVar88._4_4_;
  uStack_880._0_4_ = auVar88._8_4_;
  uStack_880._4_4_ = auVar88._12_4_;
  local_c38 = CONCAT44(local_878._4_4_ + local_888._4_4_,(int)local_878 + (int)local_888);
  uStack_c30 = CONCAT44(uStack_870._4_4_ + uStack_880._4_4_,(int)uStack_870 + (int)uStack_880);
  local_898 = local_c38;
  uStack_890 = uStack_c30;
  iVar110 = (int)local_878 + (int)local_888 + local_428;
  iVar102 = local_878._4_4_ + local_888._4_4_ + local_428;
  iVar113 = (int)uStack_870 + (int)uStack_880 + local_428;
  iVar115 = uStack_870._4_4_ + uStack_880._4_4_ + local_428;
  local_c38 = CONCAT44(iVar102,iVar110);
  uStack_c30 = CONCAT44(iVar115,iVar113);
  local_ab8 = local_c38;
  uStack_ab0 = uStack_c30;
  local_abc = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_c38 = CONCAT44(iVar102 >> auVar87,iVar110 >> auVar87);
  uStack_c30 = CONCAT44(iVar115 >> auVar87,iVar113 >> auVar87);
  local_518 = local_cf8._0_8_;
  uStack_510 = local_cf8._8_8_;
  local_528 = local_ce8._0_8_;
  uStack_520 = local_ce8._8_8_;
  local_c28 = CONCAT44(local_878._4_4_ - local_888._4_4_,(int)local_878 - (int)local_888);
  uStack_c20 = CONCAT44(uStack_870._4_4_ - uStack_880._4_4_,(int)uStack_870 - (int)uStack_880);
  local_8b8 = local_c28;
  uStack_8b0 = uStack_c20;
  iVar110 = ((int)local_878 - (int)local_888) + local_428;
  iVar115 = (local_878._4_4_ - local_888._4_4_) + local_428;
  iVar104 = ((int)uStack_870 - (int)uStack_880) + local_428;
  iVar116 = (uStack_870._4_4_ - uStack_880._4_4_) + local_428;
  local_c28 = CONCAT44(iVar115,iVar110);
  uStack_c20 = CONCAT44(iVar116,iVar104);
  local_ad8 = local_c28;
  uStack_ad0 = uStack_c20;
  local_adc = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar110 = iVar110 >> auVar87;
  iVar115 = iVar115 >> auVar87;
  iVar104 = iVar104 >> auVar87;
  iVar116 = iVar116 >> auVar87;
  local_c28 = CONCAT44(iVar115,iVar110);
  uStack_c20 = CONCAT44(iVar116,iVar104);
  local_3d8 = local_d08;
  uStack_3d0 = uStack_d00;
  auVar2._8_8_ = uStack_d00;
  auVar2._0_8_ = local_d08;
  auVar1._8_8_ = uStack_bb0;
  auVar1._0_8_ = local_bb8;
  local_cf8 = pmulld(auVar2,auVar1);
  local_3f8 = local_d18;
  uStack_3f0 = uStack_d10;
  auVar88._8_8_ = uStack_d10;
  auVar88._0_8_ = local_d18;
  auVar87._8_8_ = uStack_bb0;
  auVar87._0_8_ = local_bb8;
  local_ce8 = pmulld(auVar88,auVar87);
  local_8d8 = local_cf8._0_8_;
  uVar43 = local_8d8;
  uStack_8d0 = local_cf8._8_8_;
  uVar44 = uStack_8d0;
  local_8e8 = local_ce8._0_8_;
  uVar41 = local_8e8;
  uStack_8e0 = local_ce8._8_8_;
  uVar42 = uStack_8e0;
  local_8d8._0_4_ = local_cf8._0_4_;
  local_8d8._4_4_ = local_cf8._4_4_;
  uStack_8d0._0_4_ = local_cf8._8_4_;
  uStack_8d0._4_4_ = local_cf8._12_4_;
  local_8e8._0_4_ = local_ce8._0_4_;
  local_8e8._4_4_ = local_ce8._4_4_;
  uStack_8e0._0_4_ = local_ce8._8_4_;
  uStack_8e0._4_4_ = local_ce8._12_4_;
  local_bf8 = CONCAT44(local_8d8._4_4_ + local_8e8._4_4_,(int)local_8d8 + (int)local_8e8);
  uStack_bf0 = CONCAT44(uStack_8d0._4_4_ + uStack_8e0._4_4_,(int)uStack_8d0 + (int)uStack_8e0);
  local_8f8 = local_bf8;
  uStack_8f0 = uStack_bf0;
  iVar102 = (int)local_8d8 + (int)local_8e8 + local_428;
  iVar95 = local_8d8._4_4_ + local_8e8._4_4_ + local_428;
  iVar105 = (int)uStack_8d0 + (int)uStack_8e0 + local_428;
  iVar117 = uStack_8d0._4_4_ + uStack_8e0._4_4_ + local_428;
  local_bf8 = CONCAT44(iVar95,iVar102);
  uStack_bf0 = CONCAT44(iVar117,iVar105);
  local_af8 = local_bf8;
  uStack_af0 = uStack_bf0;
  local_afc = local_b34;
  auVar87 = ZEXT416(local_b34);
  iVar102 = iVar102 >> auVar87;
  iVar95 = iVar95 >> auVar87;
  iVar105 = iVar105 >> auVar87;
  iVar117 = iVar117 >> auVar87;
  local_bf8 = CONCAT44(iVar95,iVar102);
  uStack_bf0 = CONCAT44(iVar117,iVar105);
  local_538 = local_cf8._0_8_;
  uStack_530 = local_cf8._8_8_;
  local_548 = local_ce8._0_8_;
  uStack_540 = local_ce8._8_8_;
  local_be8 = CONCAT44(local_8d8._4_4_ - local_8e8._4_4_,(int)local_8d8 - (int)local_8e8);
  uStack_be0 = CONCAT44(uStack_8d0._4_4_ - uStack_8e0._4_4_,(int)uStack_8d0 - (int)uStack_8e0);
  local_918 = local_be8;
  uStack_910 = uStack_be0;
  iVar113 = ((int)local_8d8 - (int)local_8e8) + local_428;
  iVar96 = (local_8d8._4_4_ - local_8e8._4_4_) + local_428;
  iVar106 = ((int)uStack_8d0 - (int)uStack_8e0) + local_428;
  iVar118 = (uStack_8d0._4_4_ - uStack_8e0._4_4_) + local_428;
  local_be8 = CONCAT44(iVar96,iVar113);
  uStack_be0 = CONCAT44(iVar118,iVar106);
  local_b18 = local_be8;
  uStack_b10 = uStack_be0;
  local_b1c = local_b34;
  auVar87 = ZEXT416(local_b34);
  local_be8 = CONCAT44(iVar96 >> auVar87,iVar113 >> auVar87);
  uStack_be0 = CONCAT44(iVar118 >> auVar87,iVar106 >> auVar87);
  if (local_b38 == 0) {
    if (local_b3c + 6 < 0x10) {
      iVar85 = 0x10;
    }
    else {
      iVar85 = local_b3c + 6;
    }
    local_d1c._0_1_ = (char)iVar85;
    local_42c = -(1 << ((char)local_d1c - 1U & 0x1f));
    local_d38 = CONCAT44(local_42c,local_42c);
    uStack_d30 = CONCAT44(local_42c,local_42c);
    local_430 = (1 << ((char)local_d1c - 1U & 0x1f)) + -1;
    uVar119 = CONCAT44(local_430,local_430);
    uStack_20 = CONCAT44(local_430,local_430);
    in0[1] = local_b30 + 2;
    in0[0] = (longlong)local_b30;
    in1[1] = (longlong)&stack0xfffffffffffff2b8;
    in1[0] = (longlong)&local_d38;
    local_d1c = iVar85;
    local_928 = local_bc8;
    uStack_920 = uStack_bc0;
    local_908 = local_bc8;
    uStack_900 = uStack_bc0;
    local_8e8 = uVar41;
    uStack_8e0 = uVar42;
    local_8d8 = uVar43;
    uStack_8d0 = uVar44;
    local_8c8 = local_bc8;
    uStack_8c0 = uStack_bc0;
    local_8a8 = local_bc8;
    uStack_8a0 = uStack_bc0;
    local_888 = uVar45;
    uStack_880 = uVar46;
    local_878 = uVar47;
    uStack_870 = uVar48;
    local_868 = local_bc8;
    uStack_860 = uStack_bc0;
    local_848 = local_bc8;
    uStack_840 = uStack_bc0;
    local_828 = uVar49;
    uStack_820 = uVar50;
    local_818 = uVar51;
    uStack_810 = uVar52;
    local_808 = local_bc8;
    uStack_800 = uStack_bc0;
    local_7e8 = local_bc8;
    uStack_7e0 = uStack_bc0;
    local_7c8 = uVar53;
    uStack_7c0 = uVar54;
    local_7b8 = uVar55;
    uStack_7b0 = uVar56;
    local_7a8 = local_bc8;
    uStack_7a0 = uStack_bc0;
    local_788 = local_bc8;
    uStack_780 = uStack_bc0;
    local_768 = uVar57;
    uStack_760 = uVar58;
    local_758 = uVar59;
    uStack_750 = uVar60;
    local_748 = local_bc8;
    uStack_740 = uStack_bc0;
    local_728 = local_bc8;
    uStack_720 = uStack_bc0;
    local_708 = uVar61;
    uStack_700 = uVar62;
    local_6f8 = uVar63;
    uStack_6f0 = uVar64;
    local_6e8 = local_bc8;
    uStack_6e0 = uStack_bc0;
    local_6c8 = local_bc8;
    uStack_6c0 = uStack_bc0;
    local_6a8 = uVar65;
    uStack_6a0 = uVar66;
    local_698 = uVar67;
    uStack_690 = uVar68;
    local_688 = local_bc8;
    uStack_680 = uStack_bc0;
    local_668 = local_bc8;
    uStack_660 = uStack_bc0;
    local_658 = uVar69;
    uStack_650 = uVar70;
    local_4c8 = uVar71;
    uStack_4c0 = uVar72;
    local_4b8 = uVar73;
    uStack_4b0 = uVar74;
    local_4a8 = uVar75;
    uStack_4a0 = uVar76;
    local_498 = uVar77;
    uStack_490 = uVar78;
    local_488 = uVar79;
    uStack_480 = uVar80;
    local_478 = uVar81;
    uStack_470 = uVar82;
    local_468 = uVar83;
    uStack_460 = uVar84;
    local_408 = local_bb8;
    uStack_400 = uStack_bb0;
    local_3e8 = local_bb8;
    uStack_3e0 = uStack_bb0;
    local_3c8 = local_bb8;
    uStack_3c0 = uStack_bb0;
    local_3a8 = local_bb8;
    uStack_3a0 = uStack_bb0;
    local_388 = local_bb8;
    uStack_380 = uStack_bb0;
    local_368 = local_bb8;
    uStack_360 = uStack_bb0;
    local_348 = local_bb8;
    uStack_340 = uStack_bb0;
    local_328 = local_bb8;
    uStack_320 = uStack_bb0;
    local_308 = local_ba8;
    uStack_300 = uStack_ba0;
    local_2e8 = local_b98;
    uStack_2e0 = uStack_b90;
    local_2c8 = local_b98;
    uStack_2c0 = uStack_b90;
    local_2a8 = local_ba8;
    uStack_2a0 = uStack_ba0;
    local_288 = local_ba8;
    uStack_280 = uStack_ba0;
    local_268 = local_b98;
    uStack_260 = uStack_b90;
    local_248 = local_b98;
    uStack_240 = uStack_b90;
    local_238 = local_278;
    uStack_230 = uStack_270;
    local_228 = local_ba8;
    uStack_220 = uStack_ba0;
    local_218 = local_258;
    uStack_210 = uStack_250;
    local_208 = local_b78;
    uStack_200 = uStack_b70;
    local_1e8 = local_b88;
    uStack_1e0 = uStack_b80;
    local_1c8 = local_b88;
    uStack_1c0 = uStack_b80;
    local_1b8 = local_1f8;
    uStack_1b0 = uStack_1f0;
    local_1a8 = local_b78;
    uStack_1a0 = uStack_b70;
    local_198 = local_1d8;
    uStack_190 = uStack_1d0;
    local_188 = local_b58;
    uStack_180 = uStack_b50;
    local_168 = local_b68;
    uStack_160 = uStack_b60;
    local_148 = local_b58;
    uStack_140 = uStack_b50;
    local_138 = local_40c;
    local_134 = local_40c;
    local_130 = local_40c;
    local_12c = local_40c;
    local_128 = local_b68;
    uStack_120 = uStack_b60;
    local_118 = local_410;
    local_114 = local_410;
    local_110 = local_410;
    local_10c = local_410;
    local_108 = local_b78;
    uStack_100 = uStack_b70;
    local_f8 = local_414;
    local_f4 = local_414;
    local_f0 = local_414;
    local_ec = local_414;
    local_e8 = local_b88;
    uStack_e0 = uStack_b80;
    local_d8 = local_418;
    local_d4 = local_418;
    local_d0 = local_418;
    local_cc = local_418;
    local_c8 = local_b98;
    uStack_c0 = uStack_b90;
    local_b8 = local_41c;
    local_b4 = local_41c;
    local_b0 = local_41c;
    local_ac = local_41c;
    local_a8 = local_ba8;
    uStack_a0 = uStack_ba0;
    local_98 = local_420;
    local_94 = local_420;
    local_90 = local_420;
    local_8c = local_420;
    local_88 = local_bb8;
    uStack_80 = uStack_bb0;
    local_78 = local_424;
    local_74 = local_424;
    local_70 = local_424;
    local_6c = local_424;
    local_68 = local_bc8;
    uStack_60 = uStack_bc0;
    local_58 = local_428;
    local_54 = local_428;
    local_50 = local_428;
    local_4c = local_428;
    local_48 = local_d38;
    uStack_40 = uStack_d30;
    local_38 = local_42c;
    local_34 = local_42c;
    local_30 = local_42c;
    local_2c = local_42c;
    local_28 = uVar119;
    local_10 = local_430;
    local_c = local_430;
    local_8 = local_430;
    local_4 = local_430;
    neg_shift_sse4_1(in0,in1,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),local_430);
    in0_00[0] = local_b30 + 4;
    in0_00[1] = local_b30 + 6;
    iVar86 = (int)uVar119;
    in1_00[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_00[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_00,in1_00,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
    in0_01[0] = local_b30 + 8;
    in0_01[1] = local_b30 + 10;
    in1_01[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_01[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_01,in1_01,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
    in0_02[0] = local_b30 + 0xc;
    in0_02[1] = local_b30 + 0xe;
    in1_02[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_02[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_02,in1_02,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
    in0_03[0] = local_b30 + 0x10;
    in0_03[1] = local_b30 + 0x12;
    in1_03[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_03[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_03,in1_03,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
    in0_04[0] = local_b30 + 0x14;
    in0_04[1] = local_b30 + 0x16;
    in1_04[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_04[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_04,in1_04,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
    in0_05[0] = local_b30 + 0x18;
    in0_05[1] = local_b30 + 0x1a;
    in1_05[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_05[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_05,in1_05,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
    in0_06[0] = local_b30 + 0x1c;
    in0_06[1] = local_b30 + 0x1e;
    in1_06[1] = (longlong)&stack0xfffffffffffff2b8;
    in1_06[0] = (longlong)&local_d38;
    neg_shift_sse4_1(in0_06,in1_06,(__m128i *)(ulong)local_b40,
                     (__m128i *)CONCAT44(in_register_0000008c,in_R9D),in_stack_fffffffffffff2a8,
                     (__m128i *)CONCAT44(iVar85,in_stack_fffffffffffff2b0),iVar86);
  }
  else {
    *local_b30 = CONCAT44(iStack_cd4,local_cd8);
    local_b30[1] = CONCAT44(iStack_ccc,iStack_cd0);
    *(int *)(local_b30 + 2) = -iVar85;
    *(int *)((long)local_b30 + 0x14) = -iVar89;
    *(int *)(local_b30 + 3) = -iVar97;
    *(int *)((long)local_b30 + 0x1c) = -iVar107;
    local_b30[4] = local_d08;
    local_b30[5] = uStack_d00;
    *(int *)(local_b30 + 6) = -iVar86;
    *(int *)((long)local_b30 + 0x34) = -iVar91;
    *(int *)(local_b30 + 7) = -iVar99;
    *(int *)((long)local_b30 + 0x3c) = -iVar109;
    local_b30[8] = local_c78;
    local_b30[9] = uStack_c70;
    *(int *)(local_b30 + 10) = -iVar102;
    *(int *)((long)local_b30 + 0x54) = -iVar95;
    *(int *)(local_b30 + 0xb) = -iVar105;
    *(int *)((long)local_b30 + 0x5c) = -iVar117;
    local_b30[0xc] = local_c38;
    local_b30[0xd] = uStack_c30;
    *(int *)(local_b30 + 0xe) = -iVar98;
    *(int *)((long)local_b30 + 0x74) = -iVar93;
    *(int *)(local_b30 + 0xf) = -iVar101;
    *(int *)((long)local_b30 + 0x7c) = -iVar112;
    local_b30[0x10] = local_ca8;
    local_b30[0x11] = uStack_ca0;
    *(int *)(local_b30 + 0x12) = -iVar110;
    *(int *)((long)local_b30 + 0x94) = -iVar115;
    *(int *)(local_b30 + 0x13) = -iVar104;
    *(int *)((long)local_b30 + 0x9c) = -iVar116;
    local_b30[0x14] = local_be8;
    local_b30[0x15] = uStack_be0;
    *(int *)(local_b30 + 0x16) = -iVar108;
    *(int *)((long)local_b30 + 0xb4) = -iVar94;
    *(int *)(local_b30 + 0x17) = -iVar103;
    *(int *)((long)local_b30 + 0xbc) = -iVar114;
    local_b30[0x18] = local_378;
    local_b30[0x19] = uStack_370;
    *(int *)(local_b30 + 0x1a) = -iVar90;
    *(int *)((long)local_b30 + 0xd4) = -iVar92;
    *(int *)(local_b30 + 0x1b) = -iVar100;
    *(int *)((long)local_b30 + 0xdc) = -iVar111;
    local_b30[0x1c] = local_2b8;
    local_b30[0x1d] = uStack_2b0;
    *(int *)(local_b30 + 0x1e) = -local_cc8;
    *(int *)((long)local_b30 + 0xf4) = -iStack_cc4;
    *(int *)(local_b30 + 0x1f) = -iStack_cc0;
    *(int *)((long)local_b30 + 0xfc) = -iStack_cbc;
  }
  return;
}

Assistant:

static void iadst16x16_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i zero = _mm_setzero_si128();
  __m128i v[16], x, y, temp1, temp2;
  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  v[0] = _mm_add_epi32(x, rnding);
  v[0] = _mm_srai_epi32(v[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  v[1] = _mm_sub_epi32(zero, x);
  v[1] = _mm_add_epi32(v[1], rnding);
  v[1] = _mm_srai_epi32(v[1], bit);

  // stage 3
  v[8] = v[0];
  v[9] = v[1];

  // stage 4
  temp1 = _mm_mullo_epi32(v[8], cospi8);
  x = _mm_mullo_epi32(v[9], cospi56);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[8], cospi56);
  x = _mm_mullo_epi32(v[9], cospi8);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[8] = temp1;
  v[9] = temp2;

  // stage 5
  v[4] = v[0];
  v[5] = v[1];
  v[12] = v[8];
  v[13] = v[9];

  // stage 6
  temp1 = _mm_mullo_epi32(v[4], cospi16);
  x = _mm_mullo_epi32(v[5], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[4], cospi48);
  x = _mm_mullo_epi32(v[5], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[4] = temp1;
  v[5] = temp2;

  temp1 = _mm_mullo_epi32(v[12], cospi16);
  x = _mm_mullo_epi32(v[13], cospi48);
  temp1 = _mm_add_epi32(temp1, x);
  temp1 = _mm_add_epi32(temp1, rnding);
  temp1 = _mm_srai_epi32(temp1, bit);

  temp2 = _mm_mullo_epi32(v[12], cospi48);
  x = _mm_mullo_epi32(v[13], cospi16);
  temp2 = _mm_sub_epi32(temp2, x);
  temp2 = _mm_add_epi32(temp2, rnding);
  temp2 = _mm_srai_epi32(temp2, bit);
  v[12] = temp1;
  v[13] = temp2;

  // stage 7
  v[2] = v[0];
  v[3] = v[1];
  v[6] = v[4];
  v[7] = v[5];
  v[10] = v[8];
  v[11] = v[9];
  v[14] = v[12];
  v[15] = v[13];

  // stage 8
  y = _mm_mullo_epi32(v[2], cospi32);
  x = _mm_mullo_epi32(v[3], cospi32);
  v[2] = _mm_add_epi32(y, x);
  v[2] = _mm_add_epi32(v[2], rnding);
  v[2] = _mm_srai_epi32(v[2], bit);

  v[3] = _mm_sub_epi32(y, x);
  v[3] = _mm_add_epi32(v[3], rnding);
  v[3] = _mm_srai_epi32(v[3], bit);

  y = _mm_mullo_epi32(v[6], cospi32);
  x = _mm_mullo_epi32(v[7], cospi32);
  v[6] = _mm_add_epi32(y, x);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  v[7] = _mm_sub_epi32(y, x);
  v[7] = _mm_add_epi32(v[7], rnding);
  v[7] = _mm_srai_epi32(v[7], bit);

  y = _mm_mullo_epi32(v[10], cospi32);
  x = _mm_mullo_epi32(v[11], cospi32);
  v[10] = _mm_add_epi32(y, x);
  v[10] = _mm_add_epi32(v[10], rnding);
  v[10] = _mm_srai_epi32(v[10], bit);

  v[11] = _mm_sub_epi32(y, x);
  v[11] = _mm_add_epi32(v[11], rnding);
  v[11] = _mm_srai_epi32(v[11], bit);

  y = _mm_mullo_epi32(v[14], cospi32);
  x = _mm_mullo_epi32(v[15], cospi32);
  v[14] = _mm_add_epi32(y, x);
  v[14] = _mm_add_epi32(v[14], rnding);
  v[14] = _mm_srai_epi32(v[14], bit);

  v[15] = _mm_sub_epi32(y, x);
  v[15] = _mm_add_epi32(v[15], rnding);
  v[15] = _mm_srai_epi32(v[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = v[0];
    out[1] = _mm_sub_epi32(zero, v[8]);
    out[2] = v[12];
    out[3] = _mm_sub_epi32(zero, v[4]);
    out[4] = v[6];
    out[5] = _mm_sub_epi32(zero, v[14]);
    out[6] = v[10];
    out[7] = _mm_sub_epi32(zero, v[2]);
    out[8] = v[3];
    out[9] = _mm_sub_epi32(zero, v[11]);
    out[10] = v[15];
    out[11] = _mm_sub_epi32(zero, v[7]);
    out[12] = v[5];
    out[13] = _mm_sub_epi32(zero, v[13]);
    out[14] = v[9];
    out[15] = _mm_sub_epi32(zero, v[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(v[0], v[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(v[12], v[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[6], v[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[10], v[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[3], v[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[15], v[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[5], v[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(v[9], v[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}